

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Bounds3f * __thiscall phyr::Transform::operator()(Transform *this,Bounds3f *b)

{
  double *in_RDX;
  Bounds3<double> *in_RDI;
  Transform *M;
  Point3<double> *in_stack_fffffffffffffd18;
  Transform *in_stack_fffffffffffffd20;
  Point3<double> *in_stack_fffffffffffffd28;
  Bounds3<double> *in_stack_fffffffffffffd30;
  undefined1 local_2b8 [48];
  Point3<double> local_288 [2];
  undefined1 local_258 [48];
  Point3<double> local_228 [2];
  undefined1 local_1f8 [48];
  Point3<double> local_1c8 [2];
  undefined1 local_198 [48];
  Point3<double> local_168 [2];
  undefined1 local_138 [48];
  Point3<double> local_108 [2];
  undefined1 local_d8 [48];
  Point3<double> local_a8 [2];
  undefined1 local_78 [48];
  Point3<double> local_48;
  Point3<double> local_30;
  double *local_10;
  
  local_10 = in_RDX;
  Point3<double>::Point3(&local_48,*in_RDX,in_RDX[1],in_RDX[2]);
  operator()(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  Bounds3<double>::Bounds3(in_RDI,&local_30);
  Point3<double>::Point3(local_a8,local_10[3],local_10[1],local_10[2]);
  operator()(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  unionBounds<double>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  memcpy(in_RDI,local_78,0x30);
  Point3<double>::Point3(local_108,*local_10,local_10[4],local_10[2]);
  operator()(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  unionBounds<double>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  memcpy(in_RDI,local_d8,0x30);
  Point3<double>::Point3(local_168,*local_10,local_10[1],local_10[5]);
  operator()(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  unionBounds<double>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  memcpy(in_RDI,local_138,0x30);
  Point3<double>::Point3(local_1c8,*local_10,local_10[4],local_10[5]);
  operator()(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  unionBounds<double>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  memcpy(in_RDI,local_198,0x30);
  Point3<double>::Point3(local_228,local_10[3],local_10[4],local_10[2]);
  operator()(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  unionBounds<double>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  memcpy(in_RDI,local_1f8,0x30);
  Point3<double>::Point3(local_288,local_10[3],local_10[1],local_10[5]);
  operator()(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  unionBounds<double>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  memcpy(in_RDI,local_258,0x30);
  Point3<double>::Point3
            ((Point3<double> *)&stack0xfffffffffffffd18,local_10[3],local_10[4],local_10[5]);
  operator()(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  unionBounds<double>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  memcpy(in_RDI,local_2b8,0x30);
  return in_RDI;
}

Assistant:

inline Bounds3f operator()(const Bounds3f& b) const {
        const Transform &M = *this;
        Bounds3f ret(M(Point3f(b.pMin.x, b.pMin.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMin.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMax.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMin.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMax.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMax.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMin.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMax.y, b.pMax.z)));
        return ret;
    }